

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Map.hpp
# Opt level: O0

void __thiscall
Lib::Map<Kernel::PolyNf,_Kernel::PolyNf,_Lib::StlHash>::Map
          (Map<Kernel::PolyNf,_Kernel::PolyNf,_Lib::StlHash> *this,
          Map<Kernel::PolyNf,_Kernel::PolyNf,_Lib::StlHash> *other)

{
  Map<Kernel::PolyNf,_Kernel::PolyNf,_Lib::StlHash> *other_local;
  Map<Kernel::PolyNf,_Kernel::PolyNf,_Lib::StlHash> *this_local;
  
  this->_capacity = other->_capacity;
  this->_noOfEntries = other->_noOfEntries;
  this->_entries = other->_entries;
  this->_afterLast = other->_afterLast;
  this->_maxEntries = other->_maxEntries;
  other->_capacity = 0;
  other->_noOfEntries = 0;
  other->_entries = (Entry *)0x0;
  other->_afterLast = (Entry *)0x0;
  other->_maxEntries = 0;
  return;
}

Assistant:

Map (Map && other)
    : _capacity   (other._capacity),
      _noOfEntries(other._noOfEntries),
      _entries    (other._entries),
      _afterLast  (other._afterLast),
      _maxEntries (other._maxEntries)
  {
    other._capacity    = 0;
    other._noOfEntries = 0;
    other._entries     = nullptr;
    other._afterLast   = nullptr;
    other._maxEntries  = 0;
  }